

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

string * __thiscall
arangodb::velocypack::Builder::toJson_abi_cxx11_(string *__return_storage_ptr__,Builder *this)

{
  Slice slice;
  StringSink sink;
  Sink local_20;
  string *local_18;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20._vptr_Sink = (_func_int **)&PTR__Sink_00119c08;
  local_18 = __return_storage_ptr__;
  slice = Builder::slice(this);
  Dumper::dump(slice,&local_20,&Options::Defaults);
  return __return_storage_ptr__;
}

Assistant:

std::string Builder::toJson() const {
  std::string buffer;
  StringSink sink(&buffer);
  Dumper::dump(slice(), &sink);
  return buffer;
}